

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O0

bool __thiscall sf::Texture::create(Texture *this,uint width,uint height)

{
  Vector2u VVar1;
  uint uVar2;
  uint Y;
  int iVar3;
  ostream *poVar4;
  Uint64 UVar5;
  undefined8 uVar6;
  undefined4 local_128;
  undefined4 local_124;
  bool local_c9;
  TextureSaver local_4c;
  uint local_48;
  TextureSaver save;
  GLuint texture;
  uint uStack_3c;
  uint maxSize;
  Vector2u actualSize;
  TransientContextLock local_21;
  uint local_20;
  uint uStack_1c;
  TransientContextLock lock;
  uint height_local;
  uint width_local;
  Texture *this_local;
  
  local_20 = height;
  uStack_1c = width;
  if ((width == 0) || (height == 0)) {
    poVar4 = err();
    poVar4 = std::operator<<(poVar4,"Failed to create texture, invalid size (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uStack_1c);
    poVar4 = std::operator<<(poVar4,"x");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_20);
    poVar4 = std::operator<<(poVar4,")");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  else {
    GlResource::TransientContextLock::TransientContextLock(&local_21);
    priv::ensureExtensionsInit();
    uVar2 = getValidSize(uStack_1c);
    Y = getValidSize(local_20);
    Vector2<unsigned_int>::Vector2((Vector2<unsigned_int> *)&stack0xffffffffffffffc4,uVar2,Y);
    uVar2 = getMaximumSize();
    if ((uVar2 < uStack_3c) || (uVar2 < maxSize)) {
      poVar4 = err();
      poVar4 = std::operator<<(poVar4,"Failed to create texture, its internal size is too high ");
      poVar4 = std::operator<<(poVar4,"(");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,uStack_3c);
      poVar4 = std::operator<<(poVar4,"x");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,maxSize);
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = std::operator<<(poVar4,"maximum is ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
      poVar4 = std::operator<<(poVar4,"x");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
      poVar4 = std::operator<<(poVar4,")");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = false;
      save.m_textureBinding = 1;
    }
    else {
      (this->m_size).x = uStack_1c;
      (this->m_size).y = local_20;
      VVar1.y = maxSize;
      VVar1.x = uStack_3c;
      this->m_actualSize = VVar1;
      this->m_pixelsFlipped = false;
      this->m_fboAttachment = false;
      if (this->m_texture == 0) {
        glGenTextures(1,&local_48);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                           ,0xa2,"glGenTextures(1, &texture)");
        this->m_texture = local_48;
      }
      priv::TextureSaver::TextureSaver(&local_4c);
      if ((create(unsigned_int,unsigned_int)::textureEdgeClamp == '\0') &&
         (iVar3 = __cxa_guard_acquire(&create(unsigned_int,unsigned_int)::textureEdgeClamp),
         iVar3 != 0)) {
        local_c9 = sfogl_ext_SGIS_texture_edge_clamp != 0 || sfogl_ext_EXT_texture_edge_clamp != 0;
        create::textureEdgeClamp = local_c9;
        __cxa_guard_release(&create(unsigned_int,unsigned_int)::textureEdgeClamp);
      }
      if ((((this->m_isRepeated & 1U) == 0) && ((create::textureEdgeClamp & 1U) == 0)) &&
         ((create::warned & 1U) == 0)) {
        poVar4 = err();
        poVar4 = std::operator<<(poVar4,"OpenGL extension SGIS_texture_edge_clamp unavailable");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = err();
        poVar4 = std::operator<<(poVar4,"Artifacts may occur along texture edges");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = err();
        poVar4 = std::operator<<(poVar4,"Ensure that hardware acceleration is enabled if available")
        ;
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        create::warned = true;
      }
      if ((create(unsigned_int,unsigned_int)::textureSrgb == '\0') &&
         (iVar3 = __cxa_guard_acquire(&create(unsigned_int,unsigned_int)::textureSrgb), iVar3 != 0))
      {
        create::textureSrgb = sfogl_ext_EXT_texture_sRGB != 0;
        __cxa_guard_release(&create(unsigned_int,unsigned_int)::textureSrgb);
      }
      if (((this->m_sRgb & 1U) != 0) && ((create::textureSrgb & 1U) == 0)) {
        if ((create(unsigned_int,unsigned_int)::warned & 1U) == 0) {
          poVar4 = err();
          poVar4 = std::operator<<(poVar4,"OpenGL extension EXT_texture_sRGB unavailable");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          poVar4 = err();
          poVar4 = std::operator<<(poVar4,"Automatic sRGB to linear conversion disabled");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          create(unsigned_int,unsigned_int)::warned = true;
        }
        this->m_sRgb = false;
      }
      glBindTexture(0xde1,this->m_texture);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                         ,0xcf,"glBindTexture(GL_TEXTURE_2D, m_texture)");
      uVar6 = 0x1908;
      if ((this->m_sRgb & 1U) != 0) {
        uVar6 = 0x8c43;
      }
      glTexImage2D(0xde1,0,uVar6,(this->m_actualSize).x,(this->m_actualSize).y,0,0x1908,0x1401,0);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                         ,0xd0,
                         "glTexImage2D(GL_TEXTURE_2D, 0, (m_sRgb ? GLEXT_GL_SRGB8_ALPHA8 : GL_RGBA), m_actualSize.x, m_actualSize.y, 0, GL_RGBA, GL_UNSIGNED_BYTE, NULL)"
                        );
      if ((this->m_isRepeated & 1U) == 0) {
        local_124 = 0x2900;
        if ((create::textureEdgeClamp & 1U) != 0) {
          local_124 = 0x812f;
        }
      }
      else {
        local_124 = 0x2901;
      }
      glTexParameteri(0xde1,0x2802,local_124);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                         ,0xd1,
                         "glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, m_isRepeated ? GL_REPEAT : (textureEdgeClamp ? GLEXT_GL_CLAMP_TO_EDGE : GLEXT_GL_CLAMP))"
                        );
      if ((this->m_isRepeated & 1U) == 0) {
        local_128 = 0x2900;
        if ((create::textureEdgeClamp & 1U) != 0) {
          local_128 = 0x812f;
        }
      }
      else {
        local_128 = 0x2901;
      }
      glTexParameteri(0xde1,0x2803,local_128);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                         ,0xd2,
                         "glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, m_isRepeated ? GL_REPEAT : (textureEdgeClamp ? GLEXT_GL_CLAMP_TO_EDGE : GLEXT_GL_CLAMP))"
                        );
      glTexParameteri(0xde1,0x2800,this->m_isSmooth & 1 | 0x2600);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                         ,0xd3,
                         "glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST)"
                        );
      glTexParameteri(0xde1,0x2801,this->m_isSmooth & 1 | 0x2600);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                         ,0xd4,
                         "glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST)"
                        );
      UVar5 = anon_unknown.dwarf_d70e4::getUniqueId();
      this->m_cacheId = UVar5;
      this->m_hasMipmap = false;
      this_local._7_1_ = true;
      save.m_textureBinding = 1;
      priv::TextureSaver::~TextureSaver(&local_4c);
    }
    GlResource::TransientContextLock::~TransientContextLock(&local_21);
  }
  return this_local._7_1_;
}

Assistant:

bool Texture::create(unsigned int width, unsigned int height)
{
    // Check if texture parameters are valid before creating it
    if ((width == 0) || (height == 0))
    {
        err() << "Failed to create texture, invalid size (" << width << "x" << height << ")" << std::endl;
        return false;
    }

    TransientContextLock lock;

    // Make sure that extensions are initialized
    priv::ensureExtensionsInit();

    // Compute the internal texture dimensions depending on NPOT textures support
    Vector2u actualSize(getValidSize(width), getValidSize(height));

    // Check the maximum texture size
    unsigned int maxSize = getMaximumSize();
    if ((actualSize.x > maxSize) || (actualSize.y > maxSize))
    {
        err() << "Failed to create texture, its internal size is too high "
              << "(" << actualSize.x << "x" << actualSize.y << ", "
              << "maximum is " << maxSize << "x" << maxSize << ")"
              << std::endl;
        return false;
    }

    // All the validity checks passed, we can store the new texture settings
    m_size.x        = width;
    m_size.y        = height;
    m_actualSize    = actualSize;
    m_pixelsFlipped = false;
    m_fboAttachment = false;

    // Create the OpenGL texture if it doesn't exist yet
    if (!m_texture)
    {
        GLuint texture;
        glCheck(glGenTextures(1, &texture));
        m_texture = static_cast<unsigned int>(texture);
    }

    // Make sure that the current texture binding will be preserved
    priv::TextureSaver save;

    static bool textureEdgeClamp = GLEXT_texture_edge_clamp || GLEXT_EXT_texture_edge_clamp;

    if (!m_isRepeated && !textureEdgeClamp)
    {
        static bool warned = false;

        if (!warned)
        {
            err() << "OpenGL extension SGIS_texture_edge_clamp unavailable" << std::endl;
            err() << "Artifacts may occur along texture edges" << std::endl;
            err() << "Ensure that hardware acceleration is enabled if available" << std::endl;

            warned = true;
        }
    }

    static bool textureSrgb = GLEXT_texture_sRGB;

    if (m_sRgb && !textureSrgb)
    {
        static bool warned = false;

        if (!warned)
        {
#ifndef SFML_OPENGL_ES
            err() << "OpenGL extension EXT_texture_sRGB unavailable" << std::endl;
#else
            err() << "OpenGL ES extension EXT_sRGB unavailable" << std::endl;
#endif
            err() << "Automatic sRGB to linear conversion disabled" << std::endl;

            warned = true;
        }

        m_sRgb = false;
    }

    // Initialize the texture
    glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
    glCheck(glTexImage2D(GL_TEXTURE_2D, 0, (m_sRgb ? GLEXT_GL_SRGB8_ALPHA8 : GL_RGBA), m_actualSize.x, m_actualSize.y, 0, GL_RGBA, GL_UNSIGNED_BYTE, NULL));
    glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, m_isRepeated ? GL_REPEAT : (textureEdgeClamp ? GLEXT_GL_CLAMP_TO_EDGE : GLEXT_GL_CLAMP)));
    glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, m_isRepeated ? GL_REPEAT : (textureEdgeClamp ? GLEXT_GL_CLAMP_TO_EDGE : GLEXT_GL_CLAMP)));
    glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST));
    glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST));
    m_cacheId = getUniqueId();

    m_hasMipmap = false;

    return true;
}